

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Node * stmt(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_MemoryAllocator *allocator;
  _Bool _Var1;
  int iVar2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Token *pCVar5;
  char *pcVar6;
  C_Node *pCVar7;
  char *pcVar9;
  C_Scope *pCVar10;
  char *pcVar11;
  C_Type *pCVar12;
  int iVar13;
  size_t __n;
  C_Node *node;
  C_Token *local_50;
  char *local_48;
  char *pcStack_40;
  int64_t iVar8;
  
  local_50 = tok;
  _Var1 = C_equal(tok,"return");
  pCVar5 = local_50;
  if (_Var1) {
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_RETURN;
    pCVar3->tok = pCVar5;
    _Var1 = C_consume(rest,local_50->next,";");
    if (_Var1) {
      return pCVar3;
    }
    pCVar4 = expr(parser,&local_50,local_50->next);
    pCVar5 = C_skip(parser,local_50,";");
    *rest = pCVar5;
    C_add_type(parser,pCVar4);
    pCVar12 = parser->current_fn->ty->return_ty;
    if ((pCVar12->kind & ~TY_BOOL) != TY_STRUCT) {
      pCVar4 = C_new_cast(parser,pCVar4,pCVar12);
    }
    pCVar3->lhs = pCVar4;
    return pCVar3;
  }
  _Var1 = C_equal(local_50,"if");
  pCVar5 = local_50;
  if (_Var1) {
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = ND_IF;
    pCVar4->tok = pCVar5;
    local_50 = C_skip(parser,local_50->next,"(");
    pCVar3 = expr(parser,&local_50,local_50);
    pCVar4->cond = pCVar3;
    local_50 = C_skip(parser,local_50,")");
    pCVar3 = stmt(parser,&local_50,local_50);
    pCVar4->then = pCVar3;
    _Var1 = C_equal(local_50,"else");
    if (_Var1) {
      pCVar3 = stmt(parser,&local_50,local_50->next);
      pCVar4->els = pCVar3;
    }
    goto LAB_0012c98a;
  }
  _Var1 = C_equal(local_50,"switch");
  pCVar5 = local_50;
  if (_Var1) {
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = ND_SWITCH;
    pCVar4->tok = pCVar5;
    local_50 = C_skip(parser,local_50->next,"(");
    pCVar3 = expr(parser,&local_50,local_50);
    pCVar4->cond = pCVar3;
    local_50 = C_skip(parser,local_50,")");
    pcVar9 = parser->brk_label;
    pCVar3 = parser->current_switch;
    parser->current_switch = pCVar4;
    pcVar6 = new_unique_name(parser->memory_allocator);
    pCVar4->brk_label = pcVar6;
    parser->brk_label = pcVar6;
    pCVar7 = stmt(parser,rest,local_50);
    pCVar4->then = pCVar7;
    parser->current_switch = pCVar3;
    parser->brk_label = pcVar9;
    return pCVar4;
  }
  _Var1 = C_equal(local_50,"case");
  pCVar5 = local_50;
  if (_Var1) {
    if (parser->current_switch != (C_Node *)0x0) {
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_CASE;
      pCVar3->tok = pCVar5;
      pCVar4 = conditional(parser,&local_50,local_50->next);
      iVar8 = eval2(parser,pCVar4,(char ***)0x0);
      iVar2 = (int)iVar8;
      _Var1 = C_equal(local_50,"...");
      iVar13 = iVar2;
      if (_Var1) {
        pCVar4 = conditional(parser,&local_50,local_50->next);
        iVar8 = eval2(parser,pCVar4,(char ***)0x0);
        iVar13 = (int)iVar8;
        if (iVar13 < iVar2) {
          pcVar9 = "empty case range specified";
          goto LAB_0012d2c8;
        }
      }
      local_50 = C_skip(parser,local_50,":");
      pcVar9 = new_unique_name(parser->memory_allocator);
      pCVar3->label = pcVar9;
      pCVar4 = stmt(parser,rest,local_50);
      pCVar3->lhs = pCVar4;
      pCVar3->begin = (long)iVar2;
      pCVar3->end = (long)iVar13;
      pCVar4 = parser->current_switch;
      pCVar3->case_next = pCVar4->case_next;
      pCVar4->case_next = pCVar3;
      return pCVar3;
    }
    pcVar9 = "stray case";
LAB_0012d2c8:
    C_error_tok(parser,local_50,pcVar9);
  }
  _Var1 = C_equal(local_50,"default");
  pCVar5 = local_50;
  if (_Var1) {
    if (parser->current_switch != (C_Node *)0x0) {
      pCVar3 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      pCVar3->kind = ND_CASE;
      pCVar3->tok = pCVar5;
      local_50 = C_skip(parser,local_50->next,":");
      pcVar9 = new_unique_name(parser->memory_allocator);
      pCVar3->label = pcVar9;
      pCVar4 = stmt(parser,rest,local_50);
      pCVar3->lhs = pCVar4;
      parser->current_switch->default_case = pCVar3;
      return pCVar3;
    }
    pcVar9 = "stray default";
    goto LAB_0012d2c8;
  }
  _Var1 = C_equal(local_50,"for");
  pCVar5 = local_50;
  if (_Var1) {
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_FOR;
    pCVar3->tok = pCVar5;
    local_50 = C_skip(parser,local_50->next,"(");
    pCVar10 = (C_Scope *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x38)
    ;
    allocator = parser->memory_allocator;
    (pCVar10->vars).allocator = allocator;
    (pCVar10->tags).allocator = allocator;
    pCVar10->next = parser->scope;
    parser->scope = pCVar10;
    pcVar9 = parser->brk_label;
    pcVar6 = parser->cont_label;
    pcVar11 = new_unique_name(allocator);
    pCVar3->brk_label = pcVar11;
    parser->brk_label = pcVar11;
    pcVar11 = new_unique_name(parser->memory_allocator);
    pCVar3->cont_label = pcVar11;
    parser->cont_label = pcVar11;
    _Var1 = is_typename(parser,local_50);
    if (_Var1) {
      pCVar12 = declspec(parser,&local_50,local_50,(VarAttr *)0x0);
      pCVar4 = declaration(parser,&local_50,local_50,pCVar12,(VarAttr *)0x0);
    }
    else {
      pCVar4 = expr_stmt(parser,&local_50,local_50);
    }
    pCVar3->init = pCVar4;
    _Var1 = C_equal(local_50,";");
    if (!_Var1) {
      pCVar4 = expr(parser,&local_50,local_50);
      pCVar3->cond = pCVar4;
    }
    local_50 = C_skip(parser,local_50,";");
    _Var1 = C_equal(local_50,")");
    if (!_Var1) {
      pCVar4 = expr(parser,&local_50,local_50);
      pCVar3->inc = pCVar4;
    }
    local_50 = C_skip(parser,local_50,")");
    pCVar4 = stmt(parser,rest,local_50);
    pCVar3->then = pCVar4;
    parser->scope = parser->scope->next;
    parser->brk_label = pcVar9;
    parser->cont_label = pcVar6;
    return pCVar3;
  }
  _Var1 = C_equal(local_50,"while");
  pCVar5 = local_50;
  if (_Var1) {
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_FOR;
    pCVar3->tok = pCVar5;
    local_50 = C_skip(parser,local_50->next,"(");
    pCVar4 = expr(parser,&local_50,local_50);
    pCVar3->cond = pCVar4;
    local_50 = C_skip(parser,local_50,")");
    local_48 = parser->brk_label;
    pcStack_40 = parser->cont_label;
    pcVar9 = new_unique_name(parser->memory_allocator);
    pCVar3->brk_label = pcVar9;
    parser->brk_label = pcVar9;
    pcVar9 = new_unique_name(parser->memory_allocator);
    pCVar3->cont_label = pcVar9;
    parser->cont_label = pcVar9;
    pCVar4 = stmt(parser,rest,local_50);
    pCVar3->then = pCVar4;
    parser->brk_label = local_48;
    parser->cont_label = pcStack_40;
    return pCVar3;
  }
  _Var1 = C_equal(local_50,"do");
  pCVar5 = local_50;
  if (_Var1) {
    pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar4->kind = ND_DO;
    pCVar4->tok = pCVar5;
    local_48 = parser->brk_label;
    pcStack_40 = parser->cont_label;
    pcVar9 = new_unique_name(parser->memory_allocator);
    pCVar4->brk_label = pcVar9;
    parser->brk_label = pcVar9;
    pcVar9 = new_unique_name(parser->memory_allocator);
    pCVar4->cont_label = pcVar9;
    parser->cont_label = pcVar9;
    pCVar3 = stmt(parser,&local_50,local_50->next);
    pCVar4->then = pCVar3;
    parser->brk_label = local_48;
    parser->cont_label = pcStack_40;
    local_50 = C_skip(parser,local_50,"while");
    local_50 = C_skip(parser,local_50,"(");
    pCVar3 = expr(parser,&local_50,local_50);
    pCVar4->cond = pCVar3;
    local_50 = C_skip(parser,local_50,")");
    pCVar5 = local_50;
  }
  else {
    _Var1 = C_equal(local_50,"asm");
    if (_Var1) {
      pCVar3 = asm_stmt(parser,rest,local_50);
      return pCVar3;
    }
    _Var1 = C_equal(local_50,"goto");
    if (_Var1) {
      _Var1 = C_equal(local_50->next,"*");
      pCVar5 = local_50;
      pCVar4 = (C_Node *)
               (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
      if (_Var1) {
        pCVar4->kind = ND_GOTO_EXPR;
        pCVar4->tok = pCVar5;
        pCVar3 = expr(parser,&local_50,local_50->next->next);
        pCVar4->lhs = pCVar3;
        pCVar5 = local_50;
        goto LAB_0012d177;
      }
      pCVar4->kind = ND_GOTO;
      pCVar4->tok = pCVar5;
      pcVar9 = get_ident(parser,local_50->next);
      pCVar4->label = pcVar9;
      pCVar4->goto_next = parser->gotos;
      parser->gotos = pCVar4;
      pCVar5 = local_50->next;
    }
    else {
      _Var1 = C_equal(local_50,"break");
      pCVar5 = local_50;
      if (_Var1) {
        if (parser->brk_label == (char *)0x0) {
          pcVar9 = "stray break";
          goto LAB_0012d2c8;
        }
        pCVar4 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar4->kind = ND_GOTO;
        pCVar4->tok = pCVar5;
        pcVar9 = parser->brk_label;
      }
      else {
        _Var1 = C_equal(local_50,"continue");
        pCVar5 = local_50;
        if (!_Var1) {
          if ((local_50->kind == TK_IDENT) &&
             (_Var1 = C_equal(local_50->next,":"), pCVar5 = local_50, _Var1)) {
            pCVar3 = (C_Node *)
                     (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
            pCVar3->kind = ND_LABEL;
            pCVar3->tok = pCVar5;
            pcVar9 = local_50->loc;
            __n = (size_t)local_50->len;
            pcVar6 = (char *)(*parser->memory_allocator->calloc)
                                       (parser->memory_allocator->arena,__n + 1,1);
            memcpy(pcVar6,pcVar9,__n);
            pcVar6[__n] = '\0';
            pCVar3->label = pcVar6;
            pcVar9 = new_unique_name(parser->memory_allocator);
            pCVar3->unique_label = pcVar9;
            pCVar4 = stmt(parser,rest,local_50->next->next);
            pCVar3->lhs = pCVar4;
            pCVar3->goto_next = parser->labels;
            parser->labels = pCVar3;
            return pCVar3;
          }
          _Var1 = C_equal(local_50,"{");
          if (_Var1) {
            pCVar3 = compound_stmt(parser,rest,local_50->next);
            return pCVar3;
          }
          pCVar3 = expr_stmt(parser,rest,local_50);
          return pCVar3;
        }
        if (parser->cont_label == (char *)0x0) {
          pcVar9 = "stray continue";
          goto LAB_0012d2c8;
        }
        pCVar4 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar4->kind = ND_GOTO;
        pCVar4->tok = pCVar5;
        pcVar9 = parser->cont_label;
      }
      pCVar4->unique_label = pcVar9;
      pCVar5 = local_50;
    }
    pCVar5 = pCVar5->next;
  }
LAB_0012d177:
  local_50 = C_skip(parser,pCVar5,";");
LAB_0012c98a:
  *rest = local_50;
  return pCVar4;
}

Assistant:

static C_Node *stmt(C_Parser *parser, C_Token **rest, C_Token *tok) {
  if (C_equal(tok, "return")) {
    C_Node *node = new_node(parser, ND_RETURN, tok);
    if (C_consume(rest, tok->next, ";"))
      return node;

    C_Node *exp = expr(parser, &tok, tok->next);
    *rest = C_skip(parser, tok, ";");

    C_add_type(parser, exp);
    C_Type *ty = parser->current_fn->ty->return_ty;
    if (ty->kind != TY_STRUCT && ty->kind != TY_UNION)
      exp = C_new_cast(parser, exp, parser->current_fn->ty->return_ty);

    node->lhs = exp;
    return node;
  }

  if (C_equal(tok, "if")) {
    C_Node *node = new_node(parser, ND_IF, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");
    node->then = stmt(parser, &tok, tok);
    if (C_equal(tok, "else"))
      node->els = stmt(parser, &tok, tok->next);
    *rest = tok;
    return node;
  }

  if (C_equal(tok, "switch")) {
    C_Node *node = new_node(parser, ND_SWITCH, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    C_Node *sw = parser->current_switch;
    parser->current_switch = node;

    char *brk = parser->brk_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, rest, tok);

    parser->current_switch = sw;
    parser->brk_label = brk;
    return node;
  }

  if (C_equal(tok, "case")) {
    if (!parser->current_switch)
      C_error_tok(parser, tok, "stray case");

    C_Node *node = new_node(parser, ND_CASE, tok);
    int begin = C_const_expr(parser, &tok, tok->next);
    int end;

    if (C_equal(tok, "...")) {
      // [GNU] Case ranges, e.g. "case 1 ... 5:"
      end = C_const_expr(parser, &tok, tok->next);
      if (end < begin)
        C_error_tok(parser, tok, "empty case range specified");
    } else {
      end = begin;
    }

    tok = C_skip(parser, tok, ":");
    node->label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok);
    node->begin = begin;
    node->end = end;
    node->case_next = parser->current_switch->case_next;
    parser->current_switch->case_next = node;
    return node;
  }

  if (C_equal(tok, "default")) {
    if (!parser->current_switch)
      C_error_tok(parser, tok, "stray default");

    C_Node *node = new_node(parser, ND_CASE, tok);
    tok = C_skip(parser, tok->next, ":");
    node->label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok);
    parser->current_switch->default_case = node;
    return node;
  }

  if (C_equal(tok, "for")) {
    C_Node *node = new_node(parser, ND_FOR, tok);
    tok = C_skip(parser, tok->next, "(");

    enter_scope(parser);

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    if (is_typename(parser, tok)) {
      C_Type *basety = declspec(parser, &tok, tok, NULL);
      node->init = declaration(parser, &tok, tok, basety, NULL);
    } else {
      node->init = expr_stmt(parser, &tok, tok);
    }

    if (!C_equal(tok, ";"))
      node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ";");

    if (!C_equal(tok, ")"))
      node->inc = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    node->then = stmt(parser, rest, tok);

    leave_scope(parser);
    parser->brk_label = brk;
    parser->cont_label = cont;
    return node;
  }

  if (C_equal(tok, "while")) {
    C_Node *node = new_node(parser, ND_FOR, tok);
    tok = C_skip(parser, tok->next, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, rest, tok);

    parser->brk_label = brk;
    parser->cont_label = cont;
    return node;
  }

  if (C_equal(tok, "do")) {
    C_Node *node = new_node(parser, ND_DO, tok);

    char *brk = parser->brk_label;
    char *cont = parser->cont_label;
    parser->brk_label = node->brk_label = new_unique_name(parser->memory_allocator);
    parser->cont_label = node->cont_label = new_unique_name(parser->memory_allocator);

    node->then = stmt(parser, &tok, tok->next);

    parser->brk_label = brk;
    parser->cont_label = cont;

    tok = C_skip(parser, tok, "while");
    tok = C_skip(parser, tok, "(");
    node->cond = expr(parser, &tok, tok);
    tok = C_skip(parser, tok, ")");
    *rest = C_skip(parser, tok, ";");
    return node;
  }

  if (C_equal(tok, "asm"))
    return asm_stmt(parser, rest, tok);

  if (C_equal(tok, "goto")) {
    if (C_equal(tok->next, "*")) {
      // [GNU] `goto *ptr` jumps to the address specified by `ptr`.
      C_Node *node = new_node(parser, ND_GOTO_EXPR, tok);
      node->lhs = expr(parser, &tok, tok->next->next);
      *rest = C_skip(parser, tok, ";");
      return node;
    }

    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->label = get_ident(parser, tok->next);
    node->goto_next = parser->gotos;
    parser->gotos = node;
    *rest = C_skip(parser, tok->next->next, ";");
    return node;
  }

  if (C_equal(tok, "break")) {
    if (!parser->brk_label)
      C_error_tok(parser, tok, "stray break");
    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->unique_label = parser->brk_label;
    *rest = C_skip(parser, tok->next, ";");
    return node;
  }

  if (C_equal(tok, "continue")) {
    if (!parser->cont_label)
      C_error_tok(parser, tok, "stray continue");
    C_Node *node = new_node(parser, ND_GOTO, tok);
    node->unique_label = parser->cont_label;
    *rest = C_skip(parser, tok->next, ";");
    return node;
  }

  if (tok->kind == TK_IDENT && C_equal(tok->next, ":")) {
    C_Node *node = new_node(parser, ND_LABEL, tok);
    node->label = str_dup(parser->memory_allocator, tok->loc, tok->len);
    node->unique_label = new_unique_name(parser->memory_allocator);
    node->lhs = stmt(parser, rest, tok->next->next);
    node->goto_next = parser->labels;
    parser->labels = node;
    return node;
  }

  if (C_equal(tok, "{"))
    return compound_stmt(parser, rest, tok->next);

  return expr_stmt(parser, rest, tok);
}